

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O1

optional<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_> *
miniscript::internal::ParseHexStrEnd<(anonymous_namespace)::KeyParser>
          (optional<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>
           *__return_storage_ptr__,Span<const_char> in,size_t expected_size,KeyParser *ctx)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  uint uVar5;
  internal *this;
  long in_FS_OFFSET;
  Span<const_char> sp;
  string_view hex_str;
  string_view str;
  vector<unsigned_char,_std::allocator<unsigned_char>_> hash;
  string val;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  long *local_58;
  size_t local_50;
  long local_48 [2];
  long local_38;
  
  this = (internal *)in.m_data;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  sp.m_size = 0x29;
  sp.m_data = (char *)in.m_size;
  uVar5 = FindNextChar(this,sp,(char)expected_size);
  if ((int)uVar5 < 1) {
    (__return_storage_ptr__->
    super__Optional_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_true,_false,_false>
    .
    super__Optional_payload_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>
    ._M_engaged = false;
  }
  else {
    local_58 = local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,this,this + uVar5);
    str._M_str = (char *)local_58;
    str._M_len = local_50;
    bVar4 = IsHex(str);
    if (bVar4) {
      hex_str._M_str = (char *)local_58;
      hex_str._M_len = local_50;
      ParseHex<unsigned_char>(&local_78,hex_str);
      puVar3 = local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      puVar2 = local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar1 = local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      bVar4 = (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start == expected_size;
      if (bVar4) {
        local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        *(pointer *)
         &(__return_storage_ptr__->
          super__Optional_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_true,_false,_false>
          .
          super__Optional_payload_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>
          ._M_payload._M_value.first.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> = puVar1;
        *(pointer *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_false,_false>
                 )._M_payload.
                 super__Optional_payload<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>
                 ._M_payload._M_value.first.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> + 8) = puVar2;
        *(pointer *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_false,_false>
                 )._M_payload.
                 super__Optional_payload<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>
                 ._M_payload._M_value.first.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> + 0x10) = puVar3;
        (__return_storage_ptr__->
        super__Optional_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_true,_false,_false>
        .
        super__Optional_payload_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>
        ._M_payload._M_value.second = uVar5;
      }
      (__return_storage_ptr__->
      super__Optional_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_true,_false,_false>
      .
      super__Optional_payload_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>
      ._M_engaged = bVar4;
      if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      (__return_storage_ptr__->
      super__Optional_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_true,_false,_false>
      .
      super__Optional_payload_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>
      ._M_engaged = false;
    }
    if (local_58 != local_48) {
      operator_delete(local_58,local_48[0] + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::pair<std::vector<unsigned char>, int>> ParseHexStrEnd(Span<const char> in, const size_t expected_size,
                                                                         const Ctx& ctx)
{
    int hash_size = FindNextChar(in, ')');
    if (hash_size < 1) return {};
    std::string val = std::string(in.begin(), in.begin() + hash_size);
    if (!IsHex(val)) return {};
    auto hash = ParseHex(val);
    if (hash.size() != expected_size) return {};
    return {{std::move(hash), hash_size}};
}